

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterViewInfo::Deserialize(AlterViewInfo *this,Deserializer *deserializer)

{
  AlterViewType AVar1;
  SerializationException *this_00;
  allocator local_41;
  _Alloc_hider local_40;
  
  AVar1 = Deserializer::ReadProperty<duckdb::AlterViewType>(deserializer,300,"alter_view_type");
  if (AVar1 == RENAME_VIEW) {
    RenameViewInfo::Deserialize((RenameViewInfo *)&stack0xffffffffffffffc0,deserializer);
    (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_40._M_p;
    return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
           (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc0,
             "Unsupported type for deserialization of AlterViewInfo!",&local_41);
  SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<AlterInfo> AlterViewInfo::Deserialize(Deserializer &deserializer) {
	auto alter_view_type = deserializer.ReadProperty<AlterViewType>(300, "alter_view_type");
	unique_ptr<AlterViewInfo> result;
	switch (alter_view_type) {
	case AlterViewType::RENAME_VIEW:
		result = RenameViewInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterViewInfo!");
	}
	return std::move(result);
}